

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall CaDiCaL::Solver::disconnect_proof_tracer(Solver *this,Tracer *tracer)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  FILE *__stream;
  bool bVar5;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  int iVar6;
  char *__s;
  char *__s_00;
  char *__s_01;
  char *__s_02;
  char *in_RCX;
  char *pcVar7;
  char *pcVar8;
  Internal *pIVar9;
  Internal *this_00;
  External *this_01;
  undefined1 *this_02;
  bool bVar10;
  
  pcVar7 = "bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)";
  pIVar9 = (Internal *)this;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"bool CaDiCaL::Solver::disconnect_proof_tracer(Tracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  if (this->external == (External *)0x0) {
    disconnect_proof_tracer();
LAB_0083e59b:
    disconnect_proof_tracer();
LAB_0083e5a0:
    disconnect_proof_tracer();
  }
  else {
    pIVar9 = this->internal;
    if (pIVar9 == (Internal *)0x0) goto LAB_0083e59b;
    if ((this->_state & VALID) == 0) goto LAB_0083e5a0;
    if (tracer != (Tracer *)0x0) {
      bVar5 = Internal::disconnect_proof_tracer(pIVar9,tracer);
      return bVar5;
    }
  }
  disconnect_proof_tracer();
  pcVar8 = "bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)";
  this_00 = pIVar9;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar9,"bool CaDiCaL::Solver::disconnect_proof_tracer(StatTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  lVar2._0_1_ = pIVar9->external_prop_is_lazy;
  lVar2._1_1_ = pIVar9->forced_backt_allowed;
  lVar2._2_1_ = pIVar9->private_steps;
  lVar2._3_1_ = pIVar9->rephased;
  lVar2._4_4_ = *(undefined4 *)&pIVar9->field_0x14;
  if (lVar2 == 0) {
    disconnect_proof_tracer();
LAB_0083e5f7:
    disconnect_proof_tracer();
LAB_0083e5fc:
    disconnect_proof_tracer();
  }
  else {
    this_00 = *(Internal **)&pIVar9->preprocessing;
    if (this_00 == (Internal *)0x0) goto LAB_0083e5f7;
    if ((pIVar9->unsat & 0x6eU) == 0) goto LAB_0083e5fc;
    if ((StatTracer *)pcVar7 != (StatTracer *)0x0) {
      bVar5 = Internal::disconnect_proof_tracer(this_00,(StatTracer *)pcVar7);
      return bVar5;
    }
  }
  disconnect_proof_tracer();
  pIVar9 = this_00;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this_00,"bool CaDiCaL::Solver::disconnect_proof_tracer(FileTracer *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,in_RCX);
  lVar3._0_1_ = this_00->external_prop_is_lazy;
  lVar3._1_1_ = this_00->forced_backt_allowed;
  lVar3._2_1_ = this_00->private_steps;
  lVar3._3_1_ = this_00->rephased;
  lVar3._4_4_ = *(undefined4 *)&this_00->field_0x14;
  if (lVar3 == 0) {
    disconnect_proof_tracer();
LAB_0083e653:
    disconnect_proof_tracer();
LAB_0083e658:
    disconnect_proof_tracer();
  }
  else {
    pIVar9 = *(Internal **)&this_00->preprocessing;
    if (pIVar9 == (Internal *)0x0) goto LAB_0083e653;
    if ((this_00->unsat & 0x6eU) == 0) goto LAB_0083e658;
    if ((FileTracer *)pcVar8 != (FileTracer *)0x0) {
      bVar5 = Internal::disconnect_proof_tracer(pIVar9,(FileTracer *)pcVar8);
      return bVar5;
    }
  }
  disconnect_proof_tracer();
  lVar4._0_1_ = pIVar9->preprocessing;
  lVar4._1_1_ = pIVar9->protected_reasons;
  lVar4._2_1_ = pIVar9->force_saved_phase;
  lVar4._3_1_ = pIVar9->searching_lucky_phases;
  lVar4._4_1_ = pIVar9->stable;
  lVar4._5_1_ = pIVar9->reported;
  lVar4._6_1_ = pIVar9->external_prop;
  lVar4._7_1_ = pIVar9->did_external_prop;
  __stream = (FILE *)(pIVar9->reluctant).v;
  pcVar7 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),__stream == (FILE *)0x0 || lVar4 == 0);
  if (__stream != (FILE *)0x0 && lVar4 != 0) {
    fprintf(__stream,"%s\n","conclude");
    fflush((FILE *)(pIVar9->reluctant).v);
  }
  pcVar8 = "void CaDiCaL::Solver::conclude()";
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)pIVar9,"void CaDiCaL::Solver::conclude()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar7);
  this_01 = *(External **)&pIVar9->external_prop_is_lazy;
  if (this_01 == (External *)0x0) {
    conclude();
LAB_0083e6f3:
    conclude();
  }
  else {
    if (*(Internal **)&pIVar9->preprocessing == (Internal *)0x0) goto LAB_0083e6f3;
    uVar1._0_1_ = pIVar9->unsat;
    uVar1._1_1_ = pIVar9->iterating;
    uVar1._2_1_ = pIVar9->localsearching;
    uVar1._3_1_ = pIVar9->lookingahead;
    if ((uVar1 & 0x6e) != 0) {
      if (uVar1 == 4) {
        External::conclude_unknown(this_01);
        return (bool)extraout_AL_01;
      }
      if (uVar1 == 0x20) {
        External::conclude_sat(this_01);
        return (bool)extraout_AL_00;
      }
      if (uVar1 == 0x40) {
        Internal::conclude_unsat(*(Internal **)&pIVar9->preprocessing);
        return (bool)extraout_AL;
      }
      goto LAB_0083e6fd;
    }
  }
  conclude();
LAB_0083e6fd:
  conclude();
  bVar5 = _stderr != this_01;
  if (bVar5) {
    this_02 = (undefined1 *)0x0;
  }
  else {
    this_02 = terr;
  }
  bVar10 = _stdout == this_01;
  if (bVar10) {
    this_02 = tout;
  }
  pcVar7 = CaDiCaL::version();
  __s = identifier();
  __s_00 = compiler();
  __s_01 = date();
  __s_02 = flags();
  fputs(pcVar8,(FILE *)this_01);
  if (bVar10 || !bVar5) {
    Terminal::color((Terminal *)this_02,0x23,false);
    fputs("Version ",(FILE *)this_01);
    Terminal::code((Terminal *)this_02,"0m");
    fputs(pcVar7,(FILE *)this_01);
    if (__s != (char *)0x0) {
      Terminal::color((Terminal *)this_02,0x23,false);
      fputc(0x20,(FILE *)this_01);
      fputs(__s,(FILE *)this_01);
      Terminal::code((Terminal *)this_02,"0m");
    }
  }
  else {
    fputs("Version ",(FILE *)this_01);
    fputs(pcVar7,(FILE *)this_01);
    if (__s != (char *)0x0) {
      fputc(0x20,(FILE *)this_01);
      fputs(__s,(FILE *)this_01);
    }
  }
  fputc(10,(FILE *)this_01);
  if (__s_00 != (char *)0x0) {
    fputs(pcVar8,(FILE *)this_01);
    if (bVar10 || !bVar5) {
      Terminal::color((Terminal *)this_02,0x23,false);
    }
    fputs(__s_00,(FILE *)this_01);
    if (__s_02 != (char *)0x0) {
      fputc(0x20,(FILE *)this_01);
      fputs(__s_02,(FILE *)this_01);
    }
    if (bVar10 || !bVar5) {
      Terminal::code((Terminal *)this_02,"0m");
    }
    fputc(10,(FILE *)this_01);
  }
  if (__s_01 != (char *)0x0) {
    fputs(pcVar8,(FILE *)this_01);
    if (bVar10 || !bVar5) {
      Terminal::color((Terminal *)this_02,0x23,false);
      fputs(__s_01,(FILE *)this_01);
      Terminal::code((Terminal *)this_02,"0m");
    }
    else {
      fputs(__s_01,(FILE *)this_01);
    }
    fputc(10,(FILE *)this_01);
  }
  iVar6 = fflush((FILE *)this_01);
  return SUB41(iVar6,0);
}

Assistant:

bool Solver::disconnect_proof_tracer (Tracer *tracer) {
  LOG_API_CALL_BEGIN ("disconnect proof tracer");
  REQUIRE_VALID_STATE ();
  REQUIRE (tracer, "can not disconnect zero tracer");
  bool res = internal->disconnect_proof_tracer (tracer);
  LOG_API_CALL_RETURNS ("connect proof tracer", res);
  return res;
}